

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

QString * __thiscall
QTextDocument::toMarkdown
          (QString *__return_storage_ptr__,QTextDocument *this,MarkdownFeatures features)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QTextMarkdownWriter w;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  qsizetype local_98;
  undefined1 local_88 [16];
  QMap<QTextList_*,_QTextMarkdownWriter::ListInfo> local_78;
  QArrayData *pQStack_70;
  char16_t *local_68;
  undefined1 *puStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = (QArrayData *)0x0;
  pcStack_a0 = (char16_t *)0x0;
  local_98 = 0;
  local_b8 = 0xaaaaaaaa;
  uStack_b4 = 0xaaaaaaaa;
  uStack_b0 = 0xaaaaaaaa;
  uStack_ac = 0xaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_b8,&local_a8,3);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>_>
        )&DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextMarkdownWriter::QTextMarkdownWriter
            ((QTextMarkdownWriter *)local_88,(QTextStream *)&local_b8,features);
  bVar4 = QTextMarkdownWriter::writeAll((QTextMarkdownWriter *)local_88,this);
  qVar3 = local_98;
  pcVar2 = pcStack_a0;
  pQVar1 = local_a8;
  if (bVar4) {
    local_a8 = (QArrayData *)0x0;
    pcStack_a0 = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = (Data *)pQVar1;
    (__return_storage_ptr__->d).ptr = pcVar2;
    local_98 = 0;
    (__return_storage_ptr__->d).size = qVar3;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (pQStack_70 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_70,2,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_78.d);
  QTextStream::~QTextStream((QTextStream *)&local_b8);
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextDocument::toMarkdown(QTextDocument::MarkdownFeatures features) const
{
    QString ret;
    QTextStream s(&ret);
    QTextMarkdownWriter w(s, features);
    if (w.writeAll(this))
        return ret;
    return QString();
}